

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_79cbb::ParserImpl::ParseArgs(ParserImpl *this)

{
  String *pSVar1;
  undefined8 uVar2;
  _Manager_type p_Var3;
  TokenDetail *pTVar4;
  Lexer *pLVar5;
  Lexer *pLVar6;
  ParseException *this_00;
  undefined4 uVar7;
  ParserImpl *in_RSI;
  Lexer *local_30;
  
  pTVar4 = LookAhead(in_RSI);
  if (pTVar4->token_ != 0x116) {
    pTVar4 = LookAhead(in_RSI);
    if (pTVar4->token_ != 0x7b) {
      pTVar4 = LookAhead(in_RSI);
      if (pTVar4->token_ != 0x28) {
        __assert_fail("LookAhead().token_ == Token_String || LookAhead().token_ == \'{\' || LookAhead().token_ == \'(\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                      ,0x2c4,
                      "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseArgs()");
      }
    }
  }
  pTVar4 = LookAhead(in_RSI);
  if (pTVar4->token_ == 0x116) {
    pLVar5 = (Lexer *)operator_new(0x30);
    pTVar4 = NextToken(in_RSI);
    ((GCObject *)&pLVar5->state_)->_vptr_GCObject = (_func_int **)&PTR__SyntaxTree_00199268;
    pSVar1 = pTVar4->module_;
    uVar2 = *(undefined8 *)&pTVar4->line_;
    p_Var3 = *(_Manager_type *)&pTVar4->token_;
    pLVar5->module_ = (String *)pTVar4->field_0;
    *(String **)&(pLVar5->in_stream_).super__Function_base._M_functor = pSVar1;
    *(undefined8 *)((long)&(pLVar5->in_stream_).super__Function_base._M_functor + 8) = uVar2;
    (pLVar5->in_stream_).super__Function_base._M_manager = p_Var3;
    (pLVar5->in_stream_)._M_invoker = (_Invoker_type)0x0;
    uVar7 = 2;
  }
  else {
    pTVar4 = LookAhead(in_RSI);
    if (pTVar4->token_ == 0x7b) {
      ParseTableConstructor((ParserImpl *)&stack0xffffffffffffffd0);
      uVar7 = 1;
      pLVar5 = local_30;
    }
    else {
      NextToken(in_RSI);
      pTVar4 = LookAhead(in_RSI);
      if (pTVar4->token_ == 0x29) {
        pLVar5 = (Lexer *)0x0;
      }
      else {
        ParseExpList((ParserImpl *)&stack0xffffffffffffffd0);
        pLVar5 = local_30;
      }
      pTVar4 = NextToken(in_RSI);
      uVar7 = 0;
      if (pTVar4->token_ != 0x29) {
        this_00 = (ParseException *)__cxa_allocate_exception(0x20);
        luna::ParseException::ParseException
                  (this_00,"expect \')\' to end function call args",&in_RSI->current_);
        __cxa_throw(this_00,&luna::ParseException::typeinfo,luna::Exception::~Exception);
      }
    }
  }
  pLVar6 = (Lexer *)operator_new(0x18);
  pLVar6->state_ = (State *)&PTR__FuncCallArgs_001995e8;
  pLVar6->module_ = (String *)pLVar5;
  *(undefined4 *)&(pLVar6->in_stream_).super__Function_base._M_functor = uVar7;
  *(undefined4 *)((long)&(pLVar6->in_stream_).super__Function_base._M_functor + 4) = 0;
  this->lexer_ = pLVar6;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseArgs()
        {
            assert(LookAhead().token_ == Token_String ||
                   LookAhead().token_ == '{' ||
                   LookAhead().token_ == '(');

            std::unique_ptr<SyntaxTree> arg;
            FuncCallArgs::ArgType type;

            if (LookAhead().token_ == Token_String)
            {
                type = FuncCallArgs::String;
                arg.reset(new Terminator(NextToken()));
            }
            else if (LookAhead().token_ == '{')
            {
                type = FuncCallArgs::Table;
                arg = ParseTableConstructor();
            }
            else
            {
                type = FuncCallArgs::ExpList;
                NextToken();            // skip '('
                if (LookAhead().token_ != ')')
                    arg = ParseExpList();

                if (NextToken().token_ != ')')
                    throw ParseException("expect ')' to end function call args", current_);
            }

            return std::unique_ptr<SyntaxTree>(new FuncCallArgs(std::move(arg), type));
        }